

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O0

void google::protobuf::compiler::cpp::MessageLayoutHelper::MaybeMergeHotIntoFast
               (FieldPartitionArray *field_groups)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference this;
  size_t sVar4;
  reference src_partition;
  vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>
  *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
  local_88;
  const_iterator local_80;
  ulong local_78;
  size_t f_2;
  FieldGroup *group_1;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  size_t f_1;
  size_t num_hot_fields;
  FieldGroup *group;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  size_t f;
  size_t num_fast_fields;
  FieldPartitionArray *field_groups_local;
  
  f = 0;
  for (__range4 = (value_type *)0x0; __range4 < (value_type *)0x5;
      __range4 = (value_type *)
                 ((long)&(__range4->
                         super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar2 = std::
             array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
             ::operator[](field_groups,(size_type)__range4);
    pvVar3 = std::
             array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             ::operator[](pvVar2,4);
    __end4 = std::
             vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
             ::begin(pvVar3);
    group = (FieldGroup *)
            std::
            vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
            ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                                       *)&group), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
             ::operator*(&__end4);
      sVar4 = FieldGroup::num_fields(this);
      f = sVar4 + f;
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
      ::operator++(&__end4);
    }
  }
  f_1 = 0;
  for (__range4_1 = (value_type *)0x0; __range4_1 < (value_type *)0x5;
      __range4_1 = (value_type *)
                   ((long)&(__range4_1->
                           super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar2 = std::
             array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
             ::operator[](field_groups,(size_type)__range4_1);
    pvVar3 = std::
             array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             ::operator[](pvVar2,3);
    __end4_1 = std::
               vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
               ::begin(pvVar3);
    group_1 = (FieldGroup *)
              std::
              vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
              ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4_1,
                              (__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                               *)&group_1), bVar1) {
      f_2 = (size_t)__gnu_cxx::
                    __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                    ::operator*(&__end4_1);
      sVar4 = FieldGroup::num_fields((FieldGroup *)f_2);
      f_1 = sVar4 + f_1;
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
      ::operator++(&__end4_1);
    }
  }
  if (f + f_1 < 0x21) {
    for (local_78 = 0; local_78 < 5; local_78 = local_78 + 1) {
      pvVar2 = std::
               array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
               ::operator[](field_groups,local_78);
      pvVar3 = std::
               array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
               ::operator[](pvVar2,3);
      bVar1 = std::
              vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
              ::empty(pvVar3);
      if (!bVar1) {
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        pvVar3 = std::
                 array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                 ::operator[](pvVar2,4);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        src_partition =
             std::
             array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             ::operator[](pvVar2,3);
        FillPaddingFromPartition(pvVar3,src_partition,8);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        this_00 = (vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>
                   *)std::
                     array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                     ::operator[](pvVar2,4);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        pvVar3 = std::
                 array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                 ::operator[](pvVar2,4);
        local_88._M_current =
             (FieldGroup *)
             std::
             vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
             ::end(pvVar3);
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_const*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>
        ::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*>
                  ((__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_const*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>
                    *)&local_80,&local_88);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        pvVar3 = std::
                 array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                 ::operator[](pvVar2,3);
        __first = std::
                  vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                  ::begin(pvVar3);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        pvVar3 = std::
                 array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                 ::operator[](pvVar2,3);
        __last = std::
                 vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                 ::end(pvVar3);
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>
        ::
        insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,void>
                  (this_00,local_80,
                   (__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                    )__first._M_current,
                   (__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                    )__last._M_current);
        pvVar2 = std::
                 array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
                 ::operator[](field_groups,local_78);
        pvVar3 = std::
                 array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                 ::operator[](pvVar2,3);
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::clear(pvVar3);
      }
    }
  }
  return;
}

Assistant:

void MessageLayoutHelper::MaybeMergeHotIntoFast(
    FieldPartitionArray& field_groups) {
  size_t num_fast_fields = 0;
  for (size_t f = 0; f < kMaxFamily; ++f) {
    for (const auto& group : field_groups[f][kFastParse]) {
      num_fast_fields += group.num_fields();
    }
  }

  size_t num_hot_fields = 0;
  for (size_t f = 0; f < kMaxFamily; ++f) {
    for (const auto& group : field_groups[f][kHot]) {
      num_hot_fields += group.num_fields();
    }
  }

  if (num_fast_fields + num_hot_fields <=
      internal::TailCallTableInfo::kMaxFastFieldHasbitIndex + 1) {
    for (size_t f = 0; f < kMaxFamily; ++f) {
      if (field_groups[f][kHot].empty()) {
        continue;
      }

      FillPaddingFromPartition(field_groups[f][kFastParse],
                               field_groups[f][kHot], /*alignment=*/8);

      // Append all remaining hot fields to the end of the fast parse group.
      field_groups[f][kFastParse].insert(field_groups[f][kFastParse].end(),
                                         field_groups[f][kHot].begin(),
                                         field_groups[f][kHot].end());
      field_groups[f][kHot].clear();
    }
  }
}